

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::StringValueResult::StringValueResult
          (StringValueResult *this,CSVStates *states,CSVStateMachine *state_machine,
          shared_ptr<duckdb::CSVBufferHandle,_true> *buffer_handle,Allocator *buffer_allocator,
          idx_t result_size_p,idx_t buffer_position,CSVErrorHandler *error_hander_p,
          CSVIterator *iterator_p,bool store_line_size_p,
          shared_ptr<duckdb::CSVFileScan,_true> csv_file_scan_p,idx_t *lines_read_p,bool sniffing_p,
          string path_p,idx_t scan_id)

{
  unsafe_unique_array<ParseTypeInfo> *this_00;
  shared_ptr<duckdb::CSVFileScan,_true> *this_01;
  CSVReaderOptions *pCVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var5;
  pointer pVVar6;
  idx_t *piVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined8 uVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  CSVBufferHandle *pCVar14;
  mapped_type *this_02;
  data_ptr_t pdVar15;
  CSVFileScan *pCVar16;
  CSVBufferManager *pCVar17;
  DatabaseInstance *this_03;
  reference other;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer __p_00;
  iterator iVar18;
  const_reference pvVar19;
  mapped_type *pmVar20;
  InvalidInputException *this_04;
  long lVar21;
  ulong uVar22;
  size_t n;
  idx_t i;
  pointer __p;
  idx_t i_1;
  pointer vector;
  undefined7 in_stack_00000041;
  value_type type;
  vector<duckdb::LogicalType,_true> logical_types;
  vector<duckdb::Vector,_true> *__range1;
  string local_78;
  string *local_58;
  Allocator *local_50;
  LogicalType varchar_type;
  
  (this->super_ScannerResult).quoted = false;
  (this->super_ScannerResult).unquoted = false;
  (this->super_ScannerResult).escaped = false;
  (this->super_ScannerResult).comment = false;
  (this->super_ScannerResult).quoted_position = 0;
  (this->super_ScannerResult).last_position.buffer_pos = 0;
  (this->super_ScannerResult).last_position.buffer_size = 0;
  (this->super_ScannerResult).last_position.buffer_idx = 0;
  (this->super_ScannerResult).result_size = result_size_p;
  (this->super_ScannerResult).state_machine = state_machine;
  (this->super_ScannerResult).states = states;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->validity_mask).
  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = buffer_allocator;
  uVar13 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                     ((state_machine->dialect_options).num_cols);
  this->number_of_columns = uVar13;
  pCVar1 = state_machine->options;
  this->null_padding = pCVar1->null_padding;
  this->ignore_errors = (pCVar1->ignore_errors).value;
  this->extra_delimiter_bytes =
       (state_machine->dialect_options).state_machine_options.delimiter.value._M_string_length - 1;
  (this->null_str_ptr).super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
  super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  (this->null_str_size).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
  DataChunk::DataChunk(&this->parse_chunk);
  this->number_of_rows = 0;
  this->cur_col_id = 0;
  this->figure_out_new_line = false;
  this->error_handler = error_hander_p;
  this->iterator = iterator_p;
  (this->current_line_position).begin.buffer_pos = 0;
  (this->current_line_position).begin.buffer_size = 0;
  (this->current_line_position).begin.buffer_idx = 0;
  (this->current_line_position).end.buffer_pos = 0;
  (this->current_line_position).end.buffer_size = 0;
  (this->current_line_position).end.buffer_idx = 0;
  (this->line_positions_per_row)._M_h._M_buckets =
       &(this->line_positions_per_row)._M_h._M_single_bucket;
  (this->line_positions_per_row)._M_h._M_bucket_count = 1;
  (this->line_positions_per_row)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->line_positions_per_row)._M_h._M_element_count = 0;
  (this->line_positions_per_row)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->line_positions_per_row)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->line_positions_per_row)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->store_line_size = store_line_size_p;
  this->added_last_line = false;
  this->quoted_new_line = false;
  (this->parse_types).
  super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
  super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl = (ParseTypeInfo *)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar8 = (element_type *)
           ((csv_file_scan_p.internal.
             super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_BaseFileReader)._vptr_BaseFileReader;
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((csv_file_scan_p.internal.
             super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_BaseFileReader).file.path._M_dataplus._M_p;
  ((csv_file_scan_p.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_BaseFileReader).file.path._M_dataplus._M_p = (pointer)0x0;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar8;
  (this->csv_file_scan).internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var9;
  ((csv_file_scan_p.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)0x0;
  this_00 = &this->parse_types;
  this->lines_read =
       (idx_t *)csv_file_scan_p.internal.
                super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  this->projecting_columns = false;
  this->chunk_col_id = 0;
  this->icu_loaded = false;
  (this->buffer_handles)._M_h._M_buckets = &(this->buffer_handles)._M_h._M_single_bucket;
  (this->buffer_handles)._M_h._M_bucket_count = 1;
  (this->buffer_handles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffer_handles)._M_h._M_element_count = 0;
  (this->buffer_handles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffer_handles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffer_handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar11 = CSVReaderOptions::IgnoreErrors(state_machine->options);
  *(undefined8 *)
   ((long)&(this->current_errors).current_errors.
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->current_errors).current_errors.
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->current_errors).current_errors.
  super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
  super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_errors).current_errors.
  super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
  super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->current_errors).ignore_errors = bVar11;
  (this->current_errors).scan_id = (idx_t)path_p._M_dataplus._M_p;
  StrpTimeFormat::StrpTimeFormat(&this->date_format);
  StrpTimeFormat::StrpTimeFormat(&this->timestamp_format);
  this->sniffing = lines_read_p._0_1_;
  (this->borked_rows)._M_h._M_buckets = &(this->borked_rows)._M_h._M_single_bucket;
  (this->borked_rows)._M_h._M_bucket_count = 1;
  (this->borked_rows)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->borked_rows)._M_h._M_element_count = 0;
  (this->borked_rows)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->borked_rows)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->borked_rows)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_58 = &this->path;
  ::std::__cxx11::string::string
            ((string *)local_58,(string *)CONCAT71(in_stack_00000041,sniffing_p));
  this->first_line_is_comment = false;
  this->ignore_empty_values = true;
  if ((buffer_handle->internal).
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this_02 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->buffer_handles,&pCVar14->buffer_idx);
    shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_02,buffer_handle);
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    pdVar15 = BufferHandle::Ptr(&pCVar14->handle);
    this->buffer_ptr = (char *)pdVar15;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this->buffer_size = pCVar14->actual_size;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    iVar2 = pCVar14->buffer_idx;
    iVar3 = this->buffer_size;
    (this->super_ScannerResult).last_position.buffer_pos = buffer_position;
    (this->super_ScannerResult).last_position.buffer_size = iVar3;
    (this->super_ScannerResult).last_position.buffer_idx = iVar2;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    this->requested_size = pCVar14->requested_size;
    iVar2 = (this->iterator->pos).buffer_idx;
    iVar3 = (this->iterator->pos).buffer_pos;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(buffer_handle);
    iVar4 = pCVar14->actual_size;
    (this->current_line_position).begin.buffer_pos = iVar3;
    (this->current_line_position).begin.buffer_size = iVar4;
    (this->current_line_position).begin.buffer_idx = iVar2;
    iVar2 = (this->current_line_position).begin.buffer_size;
    (this->current_line_position).end.buffer_pos = (this->current_line_position).begin.buffer_pos;
    (this->current_line_position).end.buffer_size = iVar2;
    (this->current_line_position).end.buffer_idx = (this->current_line_position).begin.buffer_idx;
    logical_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    logical_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    logical_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    make_unsafe_uniq_array<duckdb::ParseTypeInfo>((duckdb *)&type,(ulong)this->number_of_columns);
    uVar10 = type._0_8_;
    type.id_ = INVALID;
    type.physical_type_ = ~INVALID;
    type._2_6_ = 0;
    ::std::__uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>::
    reset((__uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_> *)
          this_00,(pointer)uVar10);
    ::std::unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>::
    ~unique_ptr((unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                 *)&type);
    LogicalType::LogicalType(&varchar_type,VARCHAR);
    this_01 = &this->csv_file_scan;
    if ((this_01->internal).super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      lVar21 = 0;
      for (uVar22 = 0; uVar22 < this->number_of_columns; uVar22 = uVar22 + 1) {
        ParseTypeInfo::ParseTypeInfo((ParseTypeInfo *)&type,&varchar_type,true);
        _Var5._M_head_impl =
             (this_00->
             super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
             .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
        *(undefined1 *)((long)&(_Var5._M_head_impl)->width + lVar21) = type._4_1_;
        *(undefined4 *)((long)&(_Var5._M_head_impl)->validate_utf8 + lVar21) = type._0_4_;
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&logical_types
                   ,&LogicalType::VARCHAR);
        ::std::__cxx11::to_string(&local_78,uVar22);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                         "Column_",&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->names
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
        ::std::__cxx11::string::~string((string *)&type);
        lVar21 = lVar21 + 5;
      }
    }
    else {
      pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
      lVar21 = (long)(pCVar16->file_types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar16->file_types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)this->number_of_columns < (ulong)(lVar21 / 0x18)) {
        this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10,0x18,lVar21 % 0x18);
        ::std::__cxx11::string::string
                  ((string *)&type,
                   "Mismatch between the number of columns (%d) in the CSV file and what is expected in the scanner (%d)."
                   ,(allocator *)&local_78);
        uVar13 = this->number_of_columns;
        pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
        InvalidInputException::InvalidInputException<unsigned_int,unsigned_long>
                  (this_04,(string *)&type,uVar13,
                   ((long)(pCVar16->file_types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar16->file_types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
      pCVar17 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&pCVar16->buffer_manager);
      this_03 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar17->context->db);
      ::std::__cxx11::string::string((string *)&type,"icu",(allocator *)&local_78);
      bVar11 = DatabaseInstance::ExtensionIsLoaded(this_03,(string *)&type);
      this->icu_loaded = bVar11;
      ::std::__cxx11::string::~string((string *)&type);
      lVar21 = 0;
      uVar22 = 0;
      while( true ) {
        pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
        if ((ulong)(((long)(pCVar16->file_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar16->file_types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar22) break;
        pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
        other = vector<duckdb::LogicalType,_true>::get<true>(&pCVar16->file_types,uVar22);
        LogicalType::LogicalType(&type,other);
        bVar11 = LogicalType::IsJSONType(&type);
        if (bVar11) {
          LogicalType::LogicalType((LogicalType *)&local_78,VARCHAR);
          LogicalType::operator=(&type,(LogicalType *)&local_78);
          LogicalType::~LogicalType((LogicalType *)&local_78);
        }
        bVar11 = StringValueScanner::CanDirectlyCast(&type,this->icu_loaded);
        if (bVar11) {
          ParseTypeInfo::ParseTypeInfo((ParseTypeInfo *)&local_78,&type,true);
          _Var5._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(uint8_t *)((long)&(_Var5._M_head_impl)->width + lVar21) =
               local_78._M_dataplus._M_p._4_1_;
          *(undefined4 *)((long)&(_Var5._M_head_impl)->validate_utf8 + lVar21) =
               local_78._M_dataplus._M_p._0_4_;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalType&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &logical_types,&type);
        }
        else {
          bVar12 = 1;
          if (type.id_ != VARCHAR) {
            if (type.physical_type_ < (STRUCT|UINT32)) {
              bVar12 = (byte)(0x21800000 >> (type.physical_type_ & (STRUCT|INT32)));
            }
            else {
              bVar12 = 0;
            }
          }
          ParseTypeInfo::ParseTypeInfo((ParseTypeInfo *)&local_78,&varchar_type,(bool)(bVar12 & 1));
          _Var5._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(uint8_t *)((long)&(_Var5._M_head_impl)->width + lVar21) =
               local_78._M_dataplus._M_p._4_1_;
          *(undefined4 *)((long)&(_Var5._M_head_impl)->validate_utf8 + lVar21) =
               local_78._M_dataplus._M_p._0_4_;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &logical_types,&LogicalType::VARCHAR);
        }
        LogicalType::~LogicalType(&type);
        uVar22 = uVar22 + 1;
        lVar21 = lVar21 + 5;
      }
      pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
      __x = &CSVFileScan::GetNames_abi_cxx11_(pCVar16)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->names,__x);
      pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
      if ((pCVar16->projected_columns)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        this->projecting_columns = false;
        uVar13 = this->number_of_columns;
        __p_00 = (pointer)operator_new__((ulong)uVar13);
        switchD_0049f7f1::default(__p_00,0,(ulong)uVar13);
        type.id_ = INVALID;
        type.physical_type_ = ~INVALID;
        type._2_6_ = 0;
        ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
                  ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)&this->projected_columns,
                   __p_00);
        ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
                  ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&type);
        for (type._0_8_ = 0; (ulong)type._0_8_ < (ulong)this->number_of_columns;
            type._0_8_ = type._0_8_ + 1) {
          pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
          iVar18 = ::std::
                   _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::find(&(pCVar16->projected_columns)._M_t,(key_type *)&type);
          pCVar16 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_01);
          bVar11 = (_Rb_tree_header *)iVar18._M_node !=
                   &(pCVar16->projected_columns)._M_t._M_impl.super__Rb_tree_header;
          if (!bVar11) {
            this->projecting_columns = true;
          }
          (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[type._0_8_] = bVar11;
        }
      }
      if (this->projecting_columns == false) {
        uVar22 = ((long)logical_types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)logical_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        lVar21 = uVar22 * 5;
        for (; uVar22 < this->number_of_columns; uVar22 = uVar22 + 1) {
          ParseTypeInfo::ParseTypeInfo((ParseTypeInfo *)&type,&varchar_type,true);
          _Var5._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
          *(undefined1 *)((long)&(_Var5._M_head_impl)->width + lVar21) = type._4_1_;
          *(undefined4 *)((long)&(_Var5._M_head_impl)->validate_utf8 + lVar21) = type._0_4_;
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &logical_types,&LogicalType::VARCHAR);
          lVar21 = lVar21 + 5;
        }
      }
    }
    DataChunk::Initialize
              (&this->parse_chunk,local_50,&logical_types,(this->super_ScannerResult).result_size);
    pVVar6 = (this->parse_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (vector = (this->parse_chunk).data.
                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start; vector != pVVar6; vector = vector + 1) {
      type._0_8_ = vector->data;
      ::std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&this->vector_ptr,(void **)&type);
      FlatVector::VerifyFlatVector(vector);
      type._0_8_ = &vector->validity;
      ::std::vector<duckdb::ValidityMask*,std::allocator<duckdb::ValidityMask*>>::
      emplace_back<duckdb::ValidityMask*>
                ((vector<duckdb::ValidityMask*,std::allocator<duckdb::ValidityMask*>> *)
                 &this->validity_mask,(ValidityMask **)&type);
    }
    n = (long)(state_machine->options->null_str).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(state_machine->options->null_str).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5;
    this->null_str_count = n;
    make_unsafe_uniq_array_uninitialized<char_const*>((duckdb *)&type,n);
    uVar10 = type._0_8_;
    type.id_ = INVALID;
    type.physical_type_ = ~INVALID;
    type._2_6_ = 0;
    ::std::__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>::reset
              ((__uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_> *)
               &this->null_str_ptr,(pointer)uVar10);
    ::std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::~unique_ptr
              ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)&type);
    make_unsafe_uniq_array_uninitialized<unsigned_long>((duckdb *)&type,this->null_str_count);
    uVar10 = type._0_8_;
    type.id_ = INVALID;
    type.physical_type_ = ~INVALID;
    type._2_6_ = 0;
    ::std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
              ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)
               &this->null_str_size,(pointer)uVar10);
    ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&type);
    for (uVar22 = 0; uVar22 < this->null_str_count; uVar22 = uVar22 + 1) {
      pvVar19 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&state_machine->options->null_str,uVar22);
      (this->null_str_ptr).super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>.
      _M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar22] = (pvVar19->_M_dataplus)._M_p
      ;
      pvVar19 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&state_machine->options->null_str,uVar22);
      (this->null_str_size).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
      ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar22] = pvVar19->_M_string_length
      ;
    }
    type.id_ = DATE;
    pmVar20 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::at(&(state_machine->options->dialect_options).date_format,&type.id_);
    StrTimeFormat::operator=
              (&(this->date_format).super_StrTimeFormat,&(pmVar20->value).super_StrTimeFormat);
    type.id_ = TIMESTAMP;
    pmVar20 = ::std::
              map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              ::at(&(state_machine->options->dialect_options).date_format,&type.id_);
    StrTimeFormat::operator=
              (&(this->timestamp_format).super_StrTimeFormat,&(pmVar20->value).super_StrTimeFormat);
    this->decimal_separator = *(state_machine->options->decimal_separator)._M_dataplus._M_p;
    if (this->iterator->first_one == true) {
      piVar7 = this->lines_read;
      *piVar7 = *piVar7 + (ulong)(state_machine->dialect_options).header.value +
                          (state_machine->dialect_options).skip_rows.value;
      if (*piVar7 == 0) {
        SkipBOM(this);
      }
    }
    this->ignore_empty_values =
         ((state_machine->dialect_options).state_machine_options.comment.value != ' ' &&
         ((state_machine->dialect_options).state_machine_options.escape.value != ' ' &&
         (state_machine->dialect_options).state_machine_options.quote.value != ' ')) &&
         *(state_machine->dialect_options).state_machine_options.delimiter.value._M_dataplus._M_p !=
         ' ';
    LogicalType::~LogicalType(&varchar_type);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&logical_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  return;
}

Assistant:

StringValueResult::StringValueResult(CSVStates &states, CSVStateMachine &state_machine,
                                     const shared_ptr<CSVBufferHandle> &buffer_handle, Allocator &buffer_allocator,
                                     idx_t result_size_p, idx_t buffer_position, CSVErrorHandler &error_hander_p,
                                     CSVIterator &iterator_p, bool store_line_size_p,
                                     shared_ptr<CSVFileScan> csv_file_scan_p, idx_t &lines_read_p, bool sniffing_p,
                                     string path_p, idx_t scan_id)
    : ScannerResult(states, state_machine, result_size_p),
      number_of_columns(NumericCast<uint32_t>(state_machine.dialect_options.num_cols)),
      null_padding(state_machine.options.null_padding), ignore_errors(state_machine.options.ignore_errors.GetValue()),
      extra_delimiter_bytes(state_machine.dialect_options.state_machine_options.delimiter.GetValue().size() - 1),
      error_handler(error_hander_p), iterator(iterator_p), store_line_size(store_line_size_p),
      csv_file_scan(std::move(csv_file_scan_p)), lines_read(lines_read_p),
      current_errors(scan_id, state_machine.options.IgnoreErrors()), sniffing(sniffing_p), path(std::move(path_p)) {
	// Vector information
	D_ASSERT(number_of_columns > 0);
	if (!buffer_handle) {
		// It Was Over Before It Even Began
		D_ASSERT(iterator.done);
		return;
	}
	buffer_handles[buffer_handle->buffer_idx] = buffer_handle;
	// Buffer Information
	buffer_ptr = buffer_handle->Ptr();
	buffer_size = buffer_handle->actual_size;
	last_position = {buffer_handle->buffer_idx, buffer_position, buffer_size};
	requested_size = buffer_handle->requested_size;
	// Current Result information
	current_line_position.begin = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, buffer_handle->actual_size};
	current_line_position.end = current_line_position.begin;
	// Fill out Parse Types
	vector<LogicalType> logical_types;
	parse_types = make_unsafe_uniq_array<ParseTypeInfo>(number_of_columns);
	LogicalType varchar_type = LogicalType::VARCHAR;
	if (!csv_file_scan) {
		for (idx_t i = 0; i < number_of_columns; i++) {
			parse_types[i] = ParseTypeInfo(varchar_type, true);
			logical_types.emplace_back(LogicalType::VARCHAR);
			string name = "Column_" + to_string(i);
			names.emplace_back(name);
		}
	} else {
		if (csv_file_scan->file_types.size() > number_of_columns) {
			throw InvalidInputException(
			    "Mismatch between the number of columns (%d) in the CSV file and what is expected in the scanner (%d).",
			    number_of_columns, csv_file_scan->file_types.size());
		}
		icu_loaded = csv_file_scan->buffer_manager->context.db->ExtensionIsLoaded("icu");
		for (idx_t i = 0; i < csv_file_scan->file_types.size(); i++) {
			auto type = csv_file_scan->file_types[i];
			if (type.IsJSONType()) {
				type = LogicalType::VARCHAR;
			}
			if (StringValueScanner::CanDirectlyCast(type, icu_loaded)) {
				parse_types[i] = ParseTypeInfo(type, true);
				logical_types.emplace_back(type);
			} else {
				parse_types[i] = ParseTypeInfo(varchar_type, type.id() == LogicalTypeId::VARCHAR || type.IsNested());
				logical_types.emplace_back(LogicalType::VARCHAR);
			}
		}
		names = csv_file_scan->GetNames();
		if (!csv_file_scan->projected_columns.empty()) {
			projecting_columns = false;
			projected_columns = make_unsafe_uniq_array<bool>(number_of_columns);
			for (idx_t col_idx = 0; col_idx < number_of_columns; col_idx++) {
				if (csv_file_scan->projected_columns.find(col_idx) == csv_file_scan->projected_columns.end()) {
					// Column is not projected
					projecting_columns = true;
					projected_columns[col_idx] = false;
				} else {
					projected_columns[col_idx] = true;
				}
			}
		}
		if (!projecting_columns) {
			for (idx_t j = logical_types.size(); j < number_of_columns; j++) {
				// This can happen if we have sneaky null columns at the end that we wish to ignore
				parse_types[j] = ParseTypeInfo(varchar_type, true);
				logical_types.emplace_back(LogicalType::VARCHAR);
			}
		}
	}

	// Initialize Parse Chunk
	parse_chunk.Initialize(buffer_allocator, logical_types, result_size);
	for (auto &col : parse_chunk.data) {
		vector_ptr.push_back(FlatVector::GetData<string_t>(col));
		validity_mask.push_back(&FlatVector::Validity(col));
	}

	// Setup the NullStr information
	null_str_count = state_machine.options.null_str.size();
	null_str_ptr = make_unsafe_uniq_array_uninitialized<const char *>(null_str_count);
	null_str_size = make_unsafe_uniq_array_uninitialized<idx_t>(null_str_count);
	for (idx_t i = 0; i < null_str_count; i++) {
		null_str_ptr[i] = state_machine.options.null_str[i].c_str();
		null_str_size[i] = state_machine.options.null_str[i].size();
	}
	date_format = state_machine.options.dialect_options.date_format.at(LogicalTypeId::DATE).GetValue();
	timestamp_format = state_machine.options.dialect_options.date_format.at(LogicalTypeId::TIMESTAMP).GetValue();
	decimal_separator = state_machine.options.decimal_separator[0];

	if (iterator.first_one) {
		lines_read +=
		    state_machine.dialect_options.skip_rows.GetValue() + state_machine.dialect_options.header.GetValue();
		if (lines_read == 0) {
			SkipBOM();
		}
	}
	ignore_empty_values = state_machine.dialect_options.state_machine_options.delimiter.GetValue()[0] != ' ' &&
	                      state_machine.dialect_options.state_machine_options.quote != ' ' &&
	                      state_machine.dialect_options.state_machine_options.escape != ' ' &&
	                      state_machine.dialect_options.state_machine_options.comment != ' ';
}